

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_str.c
# Opt level: O0

adt_error_t adt_str_push(adt_str_t *self,int c)

{
  int iVar1;
  adt_error_t aVar2;
  adt_error_t local_15;
  adt_error_t result;
  adt_error_t retval;
  int c_local;
  adt_str_t *self_local;
  
  local_15 = '\0';
  if ((self == (adt_str_t *)0x0) || (c < 0)) {
    local_15 = '\x01';
  }
  else if (self->s32Cur < 0x7ffffffe) {
    aVar2 = adt_str_reserve(self,self->s32Cur + 1);
    if (aVar2 == '\0') {
      if (self->s32Size <= self->s32Cur) {
        __assert_fail("self->s32Cur < self->s32Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/adt/src/adt_str.c"
                      ,0x1f1,"adt_error_t adt_str_push(adt_str_t *, const int)");
      }
      iVar1 = self->s32Cur;
      self->s32Cur = iVar1 + 1;
      self->pAlloc[iVar1] = (uint8_t)c;
      if (self->s32Size <= self->s32Cur) {
        __assert_fail("self->s32Cur < self->s32Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/adt/src/adt_str.c"
                      ,499,"adt_error_t adt_str_push(adt_str_t *, const int)");
      }
    }
  }
  else {
    local_15 = '\x05';
  }
  return local_15;
}

Assistant:

adt_error_t adt_str_push(adt_str_t *self, const int c)
{
   adt_error_t retval = ADT_NO_ERROR;
   if( (self == 0) || (c < 0) )
   {
      retval = ADT_INVALID_ARGUMENT_ERROR;
   }
   else
   {
      if (self->s32Cur > INT_MAX-2)
      {
         retval = ADT_ARRAY_TOO_LARGE_ERROR;
      }
      else
      {
         adt_error_t result = adt_str_reserve(self, self->s32Cur+1);
         if (result == ADT_NO_ERROR)
         {
            assert(self->s32Cur < self->s32Size);
            self->pAlloc[self->s32Cur++] = (uint8_t) c;
            assert(self->s32Cur < self->s32Size);
         }
      }
   }
   return retval;
}